

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<unsigned_long,unsigned_int>
          (FlatBufferBuilderImpl<true> *this,unsigned_long element)

{
  unsigned_long *puVar1;
  uint8_t *puVar2;
  
  if (this->minalign_ < 8) {
    this->minalign_ = 8;
  }
  vector_downward<unsigned_long>::fill(&this->buf_,(ulong)(-(int)(this->buf_).size_ & 7));
  vector_downward<unsigned_long>::ensure_space(&this->buf_,8);
  puVar2 = (this->buf_).cur_;
  (this->buf_).cur_ = puVar2 + -8;
  puVar1 = &(this->buf_).size_;
  *puVar1 = *puVar1 + 8;
  *(unsigned_long *)(puVar2 + -8) = element;
  return (int)(this->buf_).size_ - (int)this->length_of_64_bit_region_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }